

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_io.c
# Opt level: O0

ssize_t tnt_io_recv(tnt_stream_net *s,char *buf,size_t size)

{
  size_t __n;
  ulong __n_00;
  size_t sVar1;
  int *piVar2;
  ssize_t top;
  size_t left;
  size_t off;
  size_t rv;
  size_t lv;
  size_t size_local;
  char *buf_local;
  tnt_stream_net *s_local;
  
  if ((s->rbuf).buf == (char *)0x0) {
    s_local = (tnt_stream_net *)tnt_io_recv_raw(s,buf,size,1);
  }
  else {
    left = 0;
    for (top = size; (s->rbuf).top < (s->rbuf).off + top; top = top - __n) {
      __n = (s->rbuf).top - (s->rbuf).off;
      __n_00 = top - __n;
      if (__n != 0) {
        memcpy(buf + left,(s->rbuf).buf + (s->rbuf).off,__n);
        left = __n + left;
      }
      (s->rbuf).off = 0;
      sVar1 = tnt_io_recv_raw(s,(s->rbuf).buf,(s->rbuf).size,0);
      if ((long)sVar1 < 1) {
        piVar2 = __errno_location();
        s->errno_ = *piVar2;
        s->error = TNT_ESYSTEM;
        return -1;
      }
      (s->rbuf).top = sVar1;
      if (__n_00 <= (s->rbuf).top) {
        memcpy(buf + left,(s->rbuf).buf,__n_00);
        (s->rbuf).off = __n_00;
        return size;
      }
    }
    memcpy(buf + left,(s->rbuf).buf + (s->rbuf).off,top);
    (s->rbuf).off = top + (s->rbuf).off;
    s_local = (tnt_stream_net *)size;
  }
  return (ssize_t)s_local;
}

Assistant:

ssize_t
tnt_io_recv(struct tnt_stream_net *s, char *buf, size_t size)
{
	if (s->rbuf.buf == NULL)
		return tnt_io_recv_raw(s, buf, size, 1);
	size_t lv, rv, off = 0, left = size;
	while (1) {
		if ((s->rbuf.off + left) <= s->rbuf.top) {
			memcpy(buf + off, s->rbuf.buf + s->rbuf.off, left);
			s->rbuf.off += left;
			return size;
		}

		lv = s->rbuf.top - s->rbuf.off;
		rv = left - lv;
		if (lv) {
			memcpy(buf + off, s->rbuf.buf + s->rbuf.off, lv);
			off += lv;
		}

		s->rbuf.off = 0;
		ssize_t top = tnt_io_recv_raw(s, s->rbuf.buf, s->rbuf.size, 0);
		if (top <= 0) {
			s->errno_ = errno;
			s->error = TNT_ESYSTEM;
			return -1;
		}

		s->rbuf.top = top;
		if (rv <= s->rbuf.top) {
			memcpy(buf + off, s->rbuf.buf, rv);
			s->rbuf.off = rv;
			return size;
		}
		left -= lv;
	}
	return -1;
}